

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtVM.c
# Opt level: O0

newtRef NVMInterpretStr(char *s,newtErr *errP)

{
  uint32_t local_34;
  newtRef nStack_30;
  newtErr err;
  newtRefVar result;
  nps_syntax_node_t *pnStack_20;
  uint32_t numStree;
  nps_syntax_node_t *stree;
  newtErr *errP_local;
  char *s_local;
  
  nStack_30 = 0xfff2;
  stree = (nps_syntax_node_t *)errP;
  errP_local = (newtErr *)s;
  local_34 = NPSParseStr(s,&stack0xffffffffffffffe0,(uint32_t *)((long)&result + 4));
  if (local_34 == 0) {
    nStack_30 = NVMInterpret2(pnStack_20,result._4_4_,(newtErr *)&local_34);
  }
  if (stree != (nps_syntax_node_t *)0x0) {
    stree->code = local_34;
  }
  return nStack_30;
}

Assistant:

newtRef NVMInterpretStr(const char * s, newtErr * errP)
{
    nps_syntax_node_t *	stree;
    uint32_t	numStree;
    newtRefVar	result = kNewtRefUnbind;
    newtErr	err;

    err = NPSParseStr(s, &stree, &numStree);

    if (err == kNErrNone)
        result = NVMInterpret2(stree, numStree, &err);

    if (errP != NULL)
        *errP = err;

    return result;
}